

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::exactResize(HighsSparseMatrix *this)

{
  bool bVar1;
  HighsSparseMatrix *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  HighsInt num_nz;
  HighsSparseMatrix *__new_size;
  
  __new_size = in_RDI;
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  }
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)in_RDI->num_col_);
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)in_RDI->num_row_);
  }
  if (in_RDI->format_ == kRowwisePartitioned) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  }
  else {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7e5df3);
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,(size_type)__new_size);
  return;
}

Assistant:

void HighsSparseMatrix::exactResize() {
  if (this->isColwise()) {
    this->start_.resize(this->num_col_ + 1);
  } else {
    this->start_.resize(this->num_row_ + 1);
  }
  const HighsInt num_nz = this->isColwise() ? this->start_[this->num_col_]
                                            : this->start_[this->num_row_];
  if (this->format_ == MatrixFormat::kRowwisePartitioned) {
    this->p_end_.resize(this->num_row_);
  } else {
    assert((int)this->p_end_.size() == 0);
    this->p_end_.clear();
  }
  this->index_.resize(num_nz);
  this->value_.resize(num_nz);
}